

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void parse_ip(packet_t *pkt)

{
  uint uVar1;
  int iVar2;
  double in_XMM0_Qa;
  int ihl;
  packet_t *pkt_local;
  
  if (pkt->payload < 0x14) {
    in_XMM0_Qa = _log(in_XMM0_Qa);
  }
  pkt->ip = (ip_t *)(pkt->data + pkt->offset);
  uVar1 = (uint)(*(byte *)pkt->ip & 0xf);
  iVar2 = uVar1 * 4;
  if (pkt->payload < iVar2) {
    _log(in_XMM0_Qa);
  }
  else {
    pkt->offset = pkt->offset + iVar2;
    pkt->payload = pkt->payload + uVar1 * -4;
    pkt->ip_proto = pkt->ip->proto;
    if (pkt->ip_proto == '\x06') {
      parse_tcp(pkt);
    }
    else if (pkt->ip_proto == '\x11') {
      parse_udp(pkt);
    }
  }
  return;
}

Assistant:

static int parse_ip(char *str, struct in_addr *addr, struct in_addr *mask)
{
	int prefix = -1;
	char ip[16] = {0};

	if (sscanf(str, "%15[^/]/%d", ip, &prefix) > 0) {

		if (inet_pton(AF_INET, ip, addr) != 1) {
			log_err("inet_pton failed: %s\n", ip);
			return -1;
		}

		if (prefix == 0) {
			mask->s_addr = 0;
		} else if (prefix > 0 && prefix <= 32) {
			mask->s_addr = htonl(0xFFFFFFFF << (32 - prefix));
		} else if (prefix == -1) {
			mask->s_addr = 0xFFFFFFFF;
		} else {
			log_err("mask \"%d\" is invalid\n", prefix);
			return -1;
		}
	} else {
		log_err("ip \"%s\" is invalid\n", str);
		return -1;
	}

	return 0;
}